

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

void __thiscall
capnp::JsonCodec::AnnotatedHandler::decode
          (AnnotatedHandler *this,JsonCodec *codec,Reader input,Builder output)

{
  Reader value;
  Reader value_00;
  bool bVar1;
  Vector<capnp::json::Value::Field::Reader> *pVVar2;
  Reader *pRVar3;
  size_t sVar4;
  size_t sVar5;
  Iterator IVar6;
  ArrayPtr<const_char> AVar7;
  Reader local_298;
  ArrayPtr<const_char> local_268;
  ArrayPtr<const_char> local_258;
  undefined1 auStack_248 [8];
  Reader field_1;
  Reader *__end3;
  Reader *__begin3;
  Vector<capnp::json::Value::Field::Reader> *__range3;
  Fault f_1;
  undefined1 local_1e8 [7];
  DebugExpression<bool> _kjCondition_1;
  Vector<capnp::json::Value::Field::Reader> retriesCopy;
  Reader local_198;
  ArrayPtr<const_char> local_168;
  ArrayPtr<const_char> local_158;
  undefined1 local_148 [8];
  Reader field;
  undefined1 local_108 [8];
  Iterator __end2;
  undefined1 local_e8 [8];
  Iterator __begin2;
  Reader *__range2;
  Vector<capnp::json::Value::Field::Reader> retries;
  HashSet<const_void_*> unionsSeen;
  Fault local_28;
  Fault f;
  DebugExpression<bool> _kjCondition;
  JsonCodec *codec_local;
  AnnotatedHandler *this_local;
  
  f.exception._6_1_ = capnp::json::Value::Reader::isObject(&input);
  f.exception._7_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 7))
  ;
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              (&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
               ,0x47e,FAILED,"input.isObject()","_kjCondition,",
               (DebugExpression<bool> *)((long)&f.exception + 7));
    kj::_::Debug::Fault::fatal(&local_28);
  }
  kj::HashSet<const_void_*>::HashSet((HashSet<const_void_*> *)&retries.builder.disposer);
  kj::Vector<capnp::json::Value::Field::Reader>::Vector
            ((Vector<capnp::json::Value::Field::Reader> *)&__range2);
  capnp::json::Value::Reader::getObject((Reader *)&__begin2.index,&input);
  IVar6 = List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader::begin((Reader *)&__begin2.index);
  __end2._8_8_ = IVar6.container;
  __begin2.container._0_4_ = IVar6.index;
  local_e8 = (undefined1  [8])__end2._8_8_;
  IVar6 = List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader::end((Reader *)&__begin2.index);
  field._reader._40_8_ = IVar6.container;
  __end2.container._0_4_ = IVar6.index;
  local_108 = (undefined1  [8])field._reader._40_8_;
  while( true ) {
    bVar1 = capnp::_::
            IndexingIterator<const_capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader,_capnp::json::Value::Field::Reader>
            ::operator==((IndexingIterator<const_capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader,_capnp::json::Value::Field::Reader>
                          *)local_e8,
                         (IndexingIterator<const_capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader,_capnp::json::Value::Field::Reader>
                          *)local_108);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader,_capnp::json::Value::Field::Reader>
    ::operator*((Reader *)local_148,
                (IndexingIterator<const_capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader,_capnp::json::Value::Field::Reader>
                 *)local_e8);
    AVar7 = (ArrayPtr<const_char>)capnp::json::Value::Field::Reader::getName((Reader *)local_148);
    local_168 = AVar7;
    local_158 = AVar7;
    capnp::json::Value::Field::Reader::getValue(&local_198,(Reader *)local_148);
    value._reader.capTable = local_198._reader.capTable;
    value._reader.segment = local_198._reader.segment;
    value._reader.data = local_198._reader.data;
    value._reader.pointers = local_198._reader.pointers;
    value._reader.dataSize = local_198._reader.dataSize;
    value._reader.pointerCount = local_198._reader.pointerCount;
    value._reader._38_2_ = local_198._reader._38_2_;
    value._reader.nestingLimit = local_198._reader.nestingLimit;
    value._reader._44_4_ = local_198._reader._44_4_;
    bVar1 = decodeField(this,codec,(StringPtr)local_158,value,output,
                        (HashSet<const_void_*> *)&retries.builder.disposer);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      kj::Vector<capnp::json::Value::Field::Reader>::add<capnp::json::Value::Field::Reader&>
                ((Vector<capnp::json::Value::Field::Reader> *)&__range2,(Reader *)local_148);
    }
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader,_capnp::json::Value::Field::Reader>
    ::operator++((IndexingIterator<const_capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader,_capnp::json::Value::Field::Reader>
                  *)local_e8);
  }
  do {
    bVar1 = kj::Vector<capnp::json::Value::Field::Reader>::empty
                      ((Vector<capnp::json::Value::Field::Reader> *)&__range2);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pVVar2 = kj::mv<kj::Vector<capnp::json::Value::Field::Reader>>
                       ((Vector<capnp::json::Value::Field::Reader> *)&__range2);
    kj::Vector<capnp::json::Value::Field::Reader>::Vector
              ((Vector<capnp::json::Value::Field::Reader> *)local_1e8,pVVar2);
    f_1.exception._6_1_ =
         kj::Vector<capnp::json::Value::Field::Reader>::empty
                   ((Vector<capnp::json::Value::Field::Reader> *)&__range2);
    f_1.exception._7_1_ =
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f_1.exception + 6))
    ;
    bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                      ((DebugExpression *)((long)&f_1.exception + 7));
    if (!bVar1) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                ((Fault *)&__range3,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                 ,0x488,FAILED,"retries.empty()","_kjCondition,",
                 (DebugExpression<bool> *)((long)&f_1.exception + 7));
      kj::_::Debug::Fault::fatal((Fault *)&__range3);
    }
    __end3 = kj::Vector<capnp::json::Value::Field::Reader>::begin
                       ((Vector<capnp::json::Value::Field::Reader> *)local_1e8);
    pRVar3 = kj::Vector<capnp::json::Value::Field::Reader>::end
                       ((Vector<capnp::json::Value::Field::Reader> *)local_1e8);
    for (; __end3 != pRVar3; __end3 = __end3 + 1) {
      auStack_248 = (undefined1  [8])(__end3->_reader).segment;
      field_1._reader.segment = (SegmentReader *)(__end3->_reader).capTable;
      field_1._reader.capTable = (CapTableReader *)(__end3->_reader).data;
      field_1._reader.data = (__end3->_reader).pointers;
      field_1._reader.pointers = *(WirePointer **)&(__end3->_reader).dataSize;
      field_1._reader.dataSize = (__end3->_reader).nestingLimit;
      field_1._reader.pointerCount = *(StructPointerCount *)&(__end3->_reader).field_0x2c;
      field_1._reader._38_2_ = *(undefined2 *)&(__end3->_reader).field_0x2e;
      AVar7 = (ArrayPtr<const_char>)
              capnp::json::Value::Field::Reader::getName((Reader *)auStack_248);
      local_268 = AVar7;
      local_258 = AVar7;
      capnp::json::Value::Field::Reader::getValue(&local_298,(Reader *)auStack_248);
      value_00._reader.capTable = local_298._reader.capTable;
      value_00._reader.segment = local_298._reader.segment;
      value_00._reader.data = local_298._reader.data;
      value_00._reader.pointers = local_298._reader.pointers;
      value_00._reader.dataSize = local_298._reader.dataSize;
      value_00._reader.pointerCount = local_298._reader.pointerCount;
      value_00._reader._38_2_ = local_298._reader._38_2_;
      value_00._reader.nestingLimit = local_298._reader.nestingLimit;
      value_00._reader._44_4_ = local_298._reader._44_4_;
      bVar1 = decodeField(this,codec,(StringPtr)local_258,value_00,output,
                          (HashSet<const_void_*> *)&retries.builder.disposer);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        kj::Vector<capnp::json::Value::Field::Reader>::add<capnp::json::Value::Field::Reader&>
                  ((Vector<capnp::json::Value::Field::Reader> *)&__range2,(Reader *)auStack_248);
      }
    }
    sVar4 = kj::Vector<capnp::json::Value::Field::Reader>::size
                      ((Vector<capnp::json::Value::Field::Reader> *)&__range2);
    sVar5 = kj::Vector<capnp::json::Value::Field::Reader>::size
                      ((Vector<capnp::json::Value::Field::Reader> *)local_1e8);
    kj::Vector<capnp::json::Value::Field::Reader>::~Vector
              ((Vector<capnp::json::Value::Field::Reader> *)local_1e8);
  } while (sVar4 != sVar5);
  kj::Vector<capnp::json::Value::Field::Reader>::~Vector
            ((Vector<capnp::json::Value::Field::Reader> *)&__range2);
  kj::HashSet<const_void_*>::~HashSet((HashSet<const_void_*> *)&retries.builder.disposer);
  return;
}

Assistant:

void decode(const JsonCodec& codec, JsonValue::Reader input,
              DynamicStruct::Builder output) const override {
    KJ_REQUIRE(input.isObject());
    kj::HashSet<const void*> unionsSeen;
    kj::Vector<JsonValue::Field::Reader> retries;
    for (auto field: input.getObject()) {
      if (!decodeField(codec, field.getName(), field.getValue(), output, unionsSeen)) {
        retries.add(field);
      }
    }
    while (!retries.empty()) {
      auto retriesCopy = kj::mv(retries);
      KJ_ASSERT(retries.empty());
      for (auto field: retriesCopy) {
        if (!decodeField(codec, field.getName(), field.getValue(), output, unionsSeen)) {
          retries.add(field);
        }
      }
      if (retries.size() == retriesCopy.size()) {
        // We made no progress in this iteration. Give up on the remaining fields.
        break;
      }
    }
  }